

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void PrintStats(int level)

{
  char *__s;
  size_t __n;
  undefined1 local_28 [8];
  TCMalloc_Printer printer;
  
  __s = (char *)operator_new(0x4000);
  printer.buf_._0_4_ = 0x4000;
  *__s = '\0';
  local_28 = (undefined1  [8])__s;
  DumpStats((TCMalloc_Printer *)local_28,level);
  __n = strlen(__s);
  write(2,__s,__n);
  operator_delete(__s);
  return;
}

Assistant:

static void PrintStats(int level) {
  const int kBufferSize = 16 << 10;
  char* buffer = new char[kBufferSize];
  TCMalloc_Printer printer(buffer, kBufferSize);
  DumpStats(&printer, level);
  auto unused = write(STDERR_FILENO, buffer, strlen(buffer));
  (void)unused;
  delete[] buffer;
}